

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Oscilloscope.cpp
# Opt level: O0

int Oscilloscope::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  EffectData *pEVar1;
  int channel;
  EffectData *data;
  int numsamples_local;
  float *buffer_local;
  char *name_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Oscilloscope::EffectData>(state);
  if (pEVar1->p[2] < 1.0) {
    HistoryBuffer::ReadBuffer
              ((HistoryBuffer *)(pEVar1->p + (long)(name[7] + -0x30) * 4 + 4),buffer,numsamples,
               numsamples,0.0);
  }
  else {
    HistoryBuffer::ReadBuffer
              ((HistoryBuffer *)(&pEVar1->field_0x90 + (long)(name[7] + -0x30) * 0x10),buffer,
               numsamples,0x1000,0.0);
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        int channel = name[7] - '0';
        if (data->p[P_Mode] >= 1.0f)
            data->spectrum[channel].ReadBuffer(buffer, numsamples, FFTSIZE / 2, 0.0f);
        else
            data->history[channel].ReadBuffer(buffer, numsamples, numsamples, 0.0f);
        return UNITY_AUDIODSP_OK;
    }